

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_functions.hpp
# Opt level: O2

void test_quadrature<WeightedPolynomial<ChebyshevT3WeightFunction>,IntegratorXX::GaussChebyshev3<double,double>,std::vector<double,std::allocator<double>>&>
               (string *msg,GaussChebyshev3<double,_double> *quad,double ref,double e,
               vector<double,_std::allocator<double>_> *args)

{
  ulong uVar1;
  double dVar2;
  StringRef macroName;
  StringRef capturedExpression;
  double local_148;
  double res;
  double local_138;
  double local_130;
  double local_128;
  string local_120;
  ITransientExpression local_100;
  double *local_f0;
  WithinAbsMatcher *local_e8;
  AssertionHandler catchAssertionHandler;
  _Vector_base<double,_std::allocator<double>_> local_98;
  WithinAbsMatcher local_80;
  
  res = 0.0;
  local_148 = 0.0;
  local_138 = ref;
  local_130 = e;
  for (uVar1 = 0;
      uVar1 < (ulong)((long)(quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>)
                            .
                            super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                            .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_finish -
                      (long)(quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>)
                            .
                            super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                            .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start >> 3); uVar1 = uVar1 + 1) {
    local_128 = (quad->super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
                super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                .weights_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[uVar1];
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)&local_98,args);
    dVar2 = WeightedPolynomial<ChebyshevT3WeightFunction>::evaluate
                      ((vector<double,_std::allocator<double>_> *)&local_98,
                       *(double *)
                        ((long)(quad->
                               super_Quadrature<IntegratorXX::GaussChebyshev3<double,_double>_>).
                               super_QuadratureBase<std::vector<double,_std::allocator<double>_>,_std::vector<double,_std::allocator<double>_>_>
                               .points_.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start + uVar1 * 8));
    local_148 = local_148 + local_128 * dVar2;
    res = local_148;
    std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base(&local_98);
  }
  local_80.super_MatcherBase<double>.super_MatcherUntypedBase._vptr_MatcherUntypedBase =
       (_func_int **)0x15b2f9;
  local_80.super_MatcherBase<double>.super_MatcherUntypedBase.m_cachedToString._M_dataplus._M_p =
       (pointer)0x79;
  macroName.m_size = 0xc;
  macroName.m_start = "REQUIRE_THAT";
  capturedExpression.m_size = 0x33;
  capturedExpression.m_start = "res, IntegratorXX::Matchers::WithinAbs(msg, ref, e)";
  Catch::AssertionHandler::AssertionHandler
            (&catchAssertionHandler,macroName,(SourceLineInfo *)&local_80,capturedExpression,Normal)
  ;
  std::__cxx11::string::string((string *)&local_120,(string *)msg);
  IntegratorXX::Matchers::WithinAbs(&local_80,&local_120,local_138,local_130);
  local_100.m_result = IntegratorXX::Matchers::WithinAbsMatcher::match(&local_80,&res);
  local_100.m_isBinaryExpression = true;
  local_100._vptr_ITransientExpression = (_func_int **)&PTR_streamReconstructedExpression_0129e200;
  local_f0 = &res;
  local_e8 = &local_80;
  Catch::AssertionHandler::handleExpr(&catchAssertionHandler,&local_100);
  Catch::ITransientExpression::~ITransientExpression(&local_100);
  IntegratorXX::Matchers::WithinAbsMatcher::~WithinAbsMatcher(&local_80);
  std::__cxx11::string::~string((string *)&local_120);
  Catch::AssertionHandler::complete(&catchAssertionHandler);
  Catch::AssertionHandler::~AssertionHandler(&catchAssertionHandler);
  return;
}

Assistant:

void test_quadrature(std::string msg, const QuadType& quad, double ref, double e, PreArgs&&... args) {
  const auto& pts = quad.points();
  const auto& wgt = quad.weights();

  double res = 0.0;
  for(auto i = 0; i < quad.npts(); ++i) {
    res += wgt[i] * TestFunction::evaluate(args..., pts[i]);
  }
  
  //standard_matcher(mes, res, ref, e);
  //printf("diff = %.6e\n", std::abs(ref - res));
  REQUIRE_THAT(res, IntegratorXX::Matchers::WithinAbs(msg, ref, e));
}